

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  initializer_list<Data::Parameter> __l;
  allocator_type local_1f9;
  allocator<char> local_1f8;
  allocator<char> local_1f7;
  allocator<char> local_1f6;
  allocator<char> local_1f5;
  allocator<char> local_1f4;
  allocator<char> local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  html serializer;
  Data data;
  Sample_t<kiste::terminal_t,_Data,_kiste::html> sample;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"Less <, Greater >, And &, Quot \", Tick \'",(allocator<char> *)&sample
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data.backgroundColor,"#ddd",(allocator<char> *)&sample);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data.formUrl,"https://www.test.com/?kiste=easy&cheesecake=yammi",
             (allocator<char> *)&sample);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data.formTarget,"somewhere",(allocator<char> *)&sample);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sample,"HIDDEN",(allocator<char> *)&serializer);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"SECRET",&local_1f1);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"Shhhh!",&local_1f2);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"TEXT",&local_1f3);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"name",&local_1f4);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_1f5);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"SUBMIT",&local_1f6);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"submit",&local_1f7);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"Submit",&local_1f8);
  __l._M_len = 3;
  __l._M_array = (iterator)&sample;
  std::vector<Data::Parameter,_std::allocator<Data::Parameter>_>::vector
            (&data.params,__l,&local_1f9);
  lVar1 = 0xc0;
  do {
    Data::Parameter::~Parameter((Parameter *)((long)&sample.child + lVar1));
    lVar1 = lVar1 + -0x60;
  } while (lVar1 != -0x60);
  serializer._os = (ostream *)&std::cout;
  sample.child = (terminal_t *)&kiste::terminal;
  sample.data = &data;
  sample._serialize = (_serializer_t *)&serializer;
  test::Sample_t<kiste::terminal_t,_Data,_kiste::html>::render(&sample);
  Data::~Data(&data);
  return 0;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::html{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}